

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O0

Status __thiscall spvtools::opt::LoopUnroller::Process(LoopUnroller *this)

{
  bool bVar1;
  bool bVar2;
  Status SVar3;
  IRContext *pIVar4;
  Module *this_00;
  reference this_01;
  LoopDescriptor *this_02;
  undefined1 local_130 [8];
  LoopUtils loop_utils;
  Loop *loop;
  iterator __end3;
  iterator __begin3;
  LoopDescriptor *__range3;
  LoopDescriptor *LD;
  Function *f;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  bool changed;
  LoopUnroller *this_local;
  
  bVar1 = false;
  pIVar4 = Pass::context(&this->super_Pass);
  this_00 = IRContext::module(pIVar4);
  join_0x00000010_0x00000000_ = Module::begin(this_00);
  _f = Module::end(this_00);
  while (bVar2 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                           ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_,
                            (UptrVectorIterator<spvtools::opt::Function,_false> *)&f), bVar2) {
    this_01 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                        ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
    bVar2 = Function::IsDeclaration(this_01);
    if (!bVar2) {
      pIVar4 = Pass::context(&this->super_Pass);
      this_02 = IRContext::GetLoopDescriptor(pIVar4,this_01);
      LoopDescriptor::begin
                ((iterator *)
                 ((long)&__end3.parent_iterators_.c.
                         super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish + 0x18),this_02);
      LoopDescriptor::end((iterator *)&loop,this_02);
      while (bVar2 = PostOrderTreeDFIterator<spvtools::opt::Loop>::operator!=
                               ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
                                ((long)&__end3.parent_iterators_.c.
                                        super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                                        ._M_impl.super__Deque_impl_data._M_finish + 0x18),
                                (PostOrderTreeDFIterator<spvtools::opt::Loop> *)&loop), bVar2) {
        loop_utils.function_ =
             (Function *)
             PostOrderTreeDFIterator<spvtools::opt::Loop>::operator*
                       ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
                        ((long)&__end3.parent_iterators_.c.
                                super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish + 0x18));
        pIVar4 = Pass::context(&this->super_Pass);
        LoopUtils::LoopUtils((LoopUtils *)local_130,pIVar4,(Loop *)loop_utils.function_);
        bVar2 = Loop::HasUnrollLoopControl((Loop *)loop_utils.function_);
        if ((bVar2) && (bVar2 = LoopUtils::CanPerformUnroll((LoopUtils *)local_130), bVar2)) {
          if (((this->super_Pass).field_0x31 & 1) == 0) {
            LoopUtils::PartiallyUnroll
                      ((LoopUtils *)local_130,(long)*(int *)&(this->super_Pass).field_0x34);
          }
          else {
            LoopUtils::FullyUnroll((LoopUtils *)local_130);
          }
          bVar1 = true;
        }
        PostOrderTreeDFIterator<spvtools::opt::Loop>::operator++
                  ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
                   ((long)&__end3.parent_iterators_.c.
                           super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish + 0x18));
      }
      PostOrderTreeDFIterator<spvtools::opt::Loop>::~PostOrderTreeDFIterator
                ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)&loop);
      PostOrderTreeDFIterator<spvtools::opt::Loop>::~PostOrderTreeDFIterator
                ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
                 ((long)&__end3.parent_iterators_.c.
                         super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish + 0x18));
      LoopDescriptor::PostModificationCleanup(this_02);
    }
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
  }
  SVar3 = SuccessWithoutChange;
  if (bVar1) {
    SVar3 = SuccessWithChange;
  }
  return SVar3;
}

Assistant:

Pass::Status LoopUnroller::Process() {
  bool changed = false;
  for (Function& f : *context()->module()) {
    if (f.IsDeclaration()) {
      continue;
    }

    LoopDescriptor* LD = context()->GetLoopDescriptor(&f);
    for (Loop& loop : *LD) {
      LoopUtils loop_utils{context(), &loop};
      if (!loop.HasUnrollLoopControl() || !loop_utils.CanPerformUnroll()) {
        continue;
      }

      if (fully_unroll_) {
        loop_utils.FullyUnroll();
      } else {
        loop_utils.PartiallyUnroll(unroll_factor_);
      }
      changed = true;
    }
    LD->PostModificationCleanup();
  }

  return changed ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}